

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall
QGraphicsItemPrivate::clearSubFocus
          (QGraphicsItemPrivate *this,QGraphicsItem *rootItem,QGraphicsItem *stopItem)

{
  bool bVar1;
  QGraphicsItemPrivate *pQVar2;
  
  if (rootItem == (QGraphicsItem *)0x0) {
    rootItem = this->q_ptr;
  }
  while( true ) {
    pQVar2 = (rootItem->d_ptr).d;
    if (pQVar2->subFocusItem != this->q_ptr) {
      return;
    }
    pQVar2->subFocusItem = (QGraphicsItem *)0x0;
    if (rootItem != stopItem) {
      bVar1 = QGraphicsItem::isAncestorOf(rootItem,stopItem);
      pQVar2 = (rootItem->d_ptr).d;
      if (!bVar1) {
        (*pQVar2->_vptr_QGraphicsItemPrivate[8])();
        pQVar2 = (rootItem->d_ptr).d;
      }
    }
    if ((pQVar2->field_0x165 & 0x40) != 0) break;
    rootItem = pQVar2->parent;
    if (rootItem == (QGraphicsItem *)0x0) {
      return;
    }
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::clearSubFocus(QGraphicsItem *rootItem, QGraphicsItem *stopItem)
{
    // Reset sub focus chain.
    QGraphicsItem *parent = rootItem ? rootItem : q_ptr;
    do {
        if (parent->d_ptr->subFocusItem != q_ptr)
            break;
        parent->d_ptr->subFocusItem = nullptr;
        if (parent != stopItem && !parent->isAncestorOf(stopItem))
            parent->d_ptr->subFocusItemChange();
    } while (!parent->isPanel() && (parent = parent->d_ptr->parent));
}